

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_detail.h
# Opt level: O2

void __thiscall
st_tree::detail::max_maintainer<unsigned_long,_std::allocator<int>_>::insert
          (max_maintainer<unsigned_long,_std::allocator<int>_> *this,unsigned_long *n)

{
  pointer puVar1;
  ulong uVar2;
  value_type_conflict2 local_20;
  
  uVar2 = *n;
  puVar1 = (this->_hist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->_hist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar2) {
    local_20 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->_hist,uVar2 + 1,&local_20);
    uVar2 = *n;
    puVar1 = (this->_hist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
  }
  puVar1[uVar2] = puVar1[uVar2] + 1;
  if (this->_max < *n) {
    this->_max = *n;
  }
  return;
}

Assistant:

void insert(const Unsigned& n) {
        if (n >= _hist.size()) _hist.resize(1+n, 0);
        _hist[n] += 1;
        if (n > _max) _max = n;
    }